

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_arith_int64(jit_State *J,TRef *sp,CType **s,MMS mm)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  TRef TVar4;
  TRef TVar5;
  uint in_ECX;
  long *in_RDX;
  uint *in_RSI;
  ushort uVar6;
  long in_RDI;
  IRType st;
  IROp op;
  MSize i;
  TRef tr;
  CTypeID id;
  IRType dt;
  short sVar7;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar8;
  undefined4 uVar9;
  int local_78;
  
  if ((*(uint *)*in_RDX >> 0x1c != 0) || (*(uint *)in_RDX[1] >> 0x1c != 0)) {
    return 0;
  }
  if ((((*(uint *)*in_RDX & 0x800000) == 0) || (*(int *)(*in_RDX + 4) != 8)) &&
     (((*(uint *)in_RDX[1] & 0x800000) == 0 || (*(int *)(in_RDX[1] + 4) != 8)))) {
    local_78 = 0x15;
    uVar9 = 0xb;
    if ((((in_ECX < 10) && (((*(uint *)*in_RDX | *(uint *)in_RDX[1]) & 0x4000000) == 0)) &&
        (*(int *)(*in_RDX + 4) == 4)) && (*(int *)(in_RDX[1] + 4) == 4)) {
      if ((((*(uint *)*in_RDX ^ *(uint *)in_RDX[1]) & 0x800000) == 0) ||
         (((in_RSI[1] & 0xffff) < 0x8000 &&
          (-1 < *(int *)(*(long *)(in_RDI + 0x10) + (ulong)(in_RSI[1] & 0xffff) * 8))))) {
        local_78 = 0x13;
        if ((*(uint *)*in_RDX & 0x800000) != 0) {
          local_78 = 0x14;
        }
        goto LAB_0015f068;
      }
      if (((*in_RSI & 0xffff) < 0x8000) &&
         (-1 < *(int *)(*(long *)(in_RDI + 0x10) + (ulong)(*in_RSI & 0xffff) * 8))) {
        local_78 = 0x13;
        if ((*(uint *)in_RDX[1] & 0x800000) != 0) {
          local_78 = 0x14;
        }
        goto LAB_0015f068;
      }
    }
  }
  else {
    local_78 = 0x16;
    uVar9 = 0xc;
  }
  for (uVar8 = 0; uVar2 = (ushort)local_78, uVar8 < 2; uVar8 = uVar8 + 1) {
    uVar3 = in_RSI[uVar8] >> 0x18 & 0x1f;
    if ((uVar3 == 0xe) || (uVar3 == 0xd)) {
      uVar1 = in_RSI[uVar8];
      *(ushort *)(in_RDI + 0x9c) = uVar2 | 0x5500;
      *(short *)(in_RDI + 0x98) = (short)uVar1;
      *(ushort *)(in_RDI + 0x9a) = (ushort)uVar3 | (ushort)(local_78 << 5) | 0x1400;
      TVar4 = lj_opt_fold((jit_State *)CONCAT44(uVar8,in_stack_ffffffffffffff78));
      in_RSI[uVar8] = TVar4;
    }
    else if ((uVar3 != 0x15) && (uVar3 != 0x16)) {
      uVar3 = in_RSI[uVar8];
      uVar6 = 0x800;
      if ((*(uint *)in_RDX[uVar8] & 0x800000) != 0) {
        uVar6 = 0;
      }
      *(ushort *)(in_RDI + 0x9c) = uVar2 | 0x5500;
      *(short *)(in_RDI + 0x98) = (short)uVar3;
      *(ushort *)(in_RDI + 0x9a) = (ushort)(local_78 << 5) | 0x13 | uVar6;
      TVar4 = lj_opt_fold((jit_State *)CONCAT44(uVar8,in_stack_ffffffffffffff78));
      in_RSI[uVar8] = TVar4;
    }
  }
  if (9 < in_ECX) {
    uVar3 = *in_RSI;
    uVar1 = in_RSI[1];
    *(ushort *)(in_RDI + 0x9c) = ((short)in_ECX + 0x1e) * 0x100 | uVar2;
    *(short *)(in_RDI + 0x98) = (short)uVar3;
    *(short *)(in_RDI + 0x9a) = (short)uVar1;
    TVar4 = lj_opt_fold((jit_State *)CONCAT44(uVar8,in_stack_ffffffffffffff78));
    TVar5 = lj_ir_kint((jit_State *)CONCAT44(uVar9,TVar4),uVar8);
    *(undefined2 *)(in_RDI + 0x9c) = 0x518a;
    *(short *)(in_RDI + 0x98) = (short)TVar5;
    *(short *)(in_RDI + 0x9a) = (short)TVar4;
    TVar4 = lj_opt_fold((jit_State *)CONCAT44(uVar8,in_stack_ffffffffffffff78));
    return TVar4;
  }
LAB_0015f068:
  if (in_ECX == 4) {
    sVar7 = 8;
  }
  else {
    sVar7 = 2;
    if (in_ECX == 6) {
      sVar7 = 0;
    }
    if ((local_78 == 0x14) || (local_78 == 0x16)) {
      sVar7 = sVar7 + 4;
    }
  }
  uVar8 = *in_RSI;
  uVar3 = in_RSI[1];
  *(ushort *)(in_RDI + 0x9c) = sVar7 << 8 | (ushort)local_78 | 0x80;
  *(short *)(in_RDI + 0x98) = (short)uVar8;
  *(short *)(in_RDI + 0x9a) = (short)uVar3;
  *(undefined4 *)(in_RDI + 300) = 2;
  return 0x2007ffd;
}

Assistant:

static TRef crec_arith_int64(jit_State *J, TRef *sp, CType **s, MMS mm)
{
  if (ctype_isnum(s[0]->info) && ctype_isnum(s[1]->info)) {
    IRType dt;
    CTypeID id;
    TRef tr;
    MSize i;
    IROp op;
    lj_needsplit(J);
    if (((s[0]->info & CTF_UNSIGNED) && s[0]->size == 8) ||
	((s[1]->info & CTF_UNSIGNED) && s[1]->size == 8)) {
      dt = IRT_U64; id = CTID_UINT64;
    } else {
      dt = IRT_I64; id = CTID_INT64;
      if (mm < MM_add &&
	  !((s[0]->info | s[1]->info) & CTF_FP) &&
	  s[0]->size == 4 && s[1]->size == 4) {  /* Try to narrow comparison. */
	if (!((s[0]->info ^ s[1]->info) & CTF_UNSIGNED) ||
	    (tref_isk(sp[1]) && IR(tref_ref(sp[1]))->i >= 0)) {
	  dt = (s[0]->info & CTF_UNSIGNED) ? IRT_U32 : IRT_INT;
	  goto comp;
	} else if (tref_isk(sp[0]) && IR(tref_ref(sp[0]))->i >= 0) {
	  dt = (s[1]->info & CTF_UNSIGNED) ? IRT_U32 : IRT_INT;
	  goto comp;
	}
      }
    }
    for (i = 0; i < 2; i++) {
      IRType st = tref_type(sp[i]);
      if (st == IRT_NUM || st == IRT_FLOAT)
	sp[i] = emitconv(sp[i], dt, st, IRCONV_TRUNC|IRCONV_ANY);
      else if (!(st == IRT_I64 || st == IRT_U64))
	sp[i] = emitconv(sp[i], dt, IRT_INT,
			 (s[i]->info & CTF_UNSIGNED) ? 0 : IRCONV_SEXT);
    }
    if (mm < MM_add) {
    comp:
      /* Assume true comparison. Fixup and emit pending guard later. */
      if (mm == MM_eq) {
	op = IR_EQ;
      } else {
	op = mm == MM_lt ? IR_LT : IR_LE;
	if (dt == IRT_U32 || dt == IRT_U64)
	  op += (IR_ULT-IR_LT);
      }
      lj_ir_set(J, IRTG(op, dt), sp[0], sp[1]);
      J->postproc = LJ_POST_FIXGUARD;
      return TREF_TRUE;
    } else {
      tr = emitir(IRT(mm+(int)IR_ADD-(int)MM_add, dt), sp[0], sp[1]);
    }
    return emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
  }
  return 0;
}